

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O2

Amap_Lib_t * Amap_LibAlloc(void)

{
  Amap_Lib_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  Aig_MmFlex_t *pAVar3;
  int nCap;
  
  nCap = 1;
  pAVar1 = (Amap_Lib_t *)calloc(1,0xa0);
  pVVar2 = Vec_PtrAlloc(nCap);
  pAVar1->vGates = pVVar2;
  pAVar3 = Aig_MmFlexStart();
  pAVar1->pMemGates = pAVar3;
  pAVar3 = Aig_MmFlexStart();
  pAVar1->pMemSet = pAVar3;
  return pAVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocs a library.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Amap_Lib_t * Amap_LibAlloc()
{
    Amap_Lib_t * p;
    p = (Amap_Lib_t *)ABC_ALLOC( Amap_Lib_t, 1 );
    memset( p, 0, sizeof(Amap_Lib_t) );
    p->vGates = Vec_PtrAlloc( 100 );
    p->pMemGates = Aig_MmFlexStart();
    p->pMemSet = Aig_MmFlexStart();
    return p;
}